

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFile.cpp
# Opt level: O1

DatFile * __thiscall DatUnpacker::DatFile::operator<<(DatFile *this,unsigned_short value)

{
  undefined1 local_12 [2];
  
  std::ostream::write((char *)&this->_ofstream,(long)local_12);
  std::ostream::flush();
  return this;
}

Assistant:

DatFile& DatFile::operator<<(unsigned short value)
    {
        if (_endianness == Endianness::Big)
        {
            value = _swap(value);
        }
        _ofstream.write((char*)&value, 2);
        _ofstream.flush();

        return *this;
    }